

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_DropInventory
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  AInventory *pAVar2;
  int iVar3;
  char *pcVar4;
  AActor *this;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_0043112f;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00431116:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0043112f:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x417,
                  "int AF_AActor_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_00431092;
    bVar1 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0043112f;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_00431116;
LAB_00431092:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_00431157;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_0043111f:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_00431157;
  }
  pAVar2 = (AInventory *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (pAVar2 == (AInventory *)0x0) goto LAB_004310bd;
  }
  else {
    if (pAVar2 != (AInventory *)0x0) goto LAB_0043111f;
LAB_004310bd:
    NullParam("\"item\"");
    pAVar2 = (AInventory *)param[1].field_0.field_1.a;
  }
  bVar1 = DObject::IsKindOf((DObject *)pAVar2,AInventory::RegistrationInfo.MyClass);
  if (bVar1) {
    pAVar2 = AActor::DropInventory(this,pAVar2);
    if (numret < 1) {
      iVar3 = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x419,
                      "int AF_AActor_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      iVar3 = 1;
      VMReturn::SetPointer(ret,pAVar2,1);
    }
    return iVar3;
  }
  pcVar4 = "item == NULL || item->IsKindOf(RUNTIME_CLASS(AInventory))";
LAB_00431157:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x418,
                "int AF_AActor_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, DropInventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(item, AInventory);
	ACTION_RETURN_OBJECT(self->DropInventory(item));
}